

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceResetOverclockSettings(zes_device_handle_t hDevice,ze_bool_t onShippedState)

{
  zes_pfnDeviceResetOverclockSettings_t pfnResetOverclockSettings;
  ze_result_t result;
  ze_bool_t onShippedState_local;
  zes_device_handle_t hDevice_local;
  
  pfnResetOverclockSettings._0_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cac8 != (code *)0x0) {
    pfnResetOverclockSettings._0_4_ = (*DAT_0011cac8)(hDevice,onShippedState);
  }
  return (ze_result_t)pfnResetOverclockSettings;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceResetOverclockSettings(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        ze_bool_t onShippedState                        ///< [in] True will reset to shipped state; false will reset to
                                                        ///< manufacturing state
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnResetOverclockSettings = context.zesDdiTable.Device.pfnResetOverclockSettings;
        if( nullptr != pfnResetOverclockSettings )
        {
            result = pfnResetOverclockSettings( hDevice, onShippedState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }